

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalJacobianPreInt
          (ChElementBeamANCF_3243 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  ulong uVar9;
  long lVar10;
  long startCol;
  ulong row;
  long lVar11;
  uint v;
  long lVar12;
  ulong col;
  undefined1 auVar13 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  ChMatrixNM<double,_1,_NSF>_conflict tempRow0;
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict ScaledMassMatrix;
  ChMatrixNM<double,_1,_NSF>_conflict tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict tempRow1;
  MatrixNxN K_K13Compact;
  Matrix3xN temp;
  Matrix3xN e_bar;
  Matrix3xN e_bar_dot;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  double local_2af0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>
  local_2ae8;
  Matrix<double,_1,_8,_1,_1,_8> local_2ac0;
  Matrix<double,_9,_64,_0,_9,_64> *local_2a60 [36];
  Matrix<double,_1,_8,_1,_1,_8> local_2940;
  Matrix<double,_1,_8,_1,_1,_8> local_2900;
  undefined1 local_28c0 [16];
  scalar_constant_op<double> sStack_28b0;
  variable_if_dynamic<long,__1> vStack_28a8;
  variable_if_dynamic<long,__1> vStack_28a0;
  double dStack_2898;
  PlainObjectBase<Eigen::Matrix<double,3,8,1,3,8>> local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  Matrix<double,_3,_8,_1,_3,_8> local_2600;
  StorageBaseType local_2540 [192];
  Matrix<double,_9,_64,_0,_9,_64> local_2480;
  Matrix<double,_9,_64,_0,_9,_64> local_1280;
  
  local_2af0 = Mfactor;
  CalcCoordMatrix(this,(Matrix3xN *)&local_2600);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_2540);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = Kfactor;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = Rfactor;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->m_Alpha;
  auVar13 = vfmadd132sd_fma(auVar14,auVar3,auVar13);
  local_2a60[0] = auVar13._0_8_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>
                    *)&local_2480,(double *)local_2a60,(StorageBaseType *)&local_2600);
  local_2ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[0]
       = Kfactor * this->m_Alpha;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>
                    *)local_28c0,(double *)&local_2ac0,local_2540);
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [3] = local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.
        array[2];
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [4] = local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.
        array[3];
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [8] = sStack_28b0.m_other;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [9] = (double)vStack_28a8.m_value;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,8,1,3,8>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,8,1,3,8>const>const,Eigen::Matrix<double,3,8,1,3,8>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,8,1,3,8>const>const,Eigen::Matrix<double,3,8,1,3,8>const>const>>
            (local_26c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>,_const_Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>_>
              *)&local_1280);
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [3] = 0.0;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [4] = 0.0;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [5] = 3.95252516672997e-323;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [0] = (double)local_26c0;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [2] = (double)local_26c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,8,1,3,8>,1,8,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>> *)&local_2ac0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_1,_8,_false>_> *)
             &local_1280);
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [0] = (double)local_2680;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [4] = 0.0;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [5] = 3.95252516672997e-323;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [2] = (double)local_26c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,8,1,3,8>,1,8,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>> *)&local_2900,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_1,_8,_false>_> *)
             &local_1280);
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [0] = (double)local_2640;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [3] = 9.88131291682493e-324;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [4] = 0.0;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [5] = 3.95252516672997e-323;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [2] = (double)local_26c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,8,1,3,8>,1,8,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,8,1,1,8>> *)&local_2940,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_1,_8,_false>_> *)
             &local_1280);
  lVar11 = 0;
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false> *)local_28c0,&local_2600,0,
               lVar12);
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [6] = (double)&local_2ac0;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [4] = (double)vStack_28a0.m_value;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [5] = dStack_2898;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [0] = (double)local_28c0._0_8_;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [1] = (double)local_28c0._8_8_;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [2] = sStack_28b0.m_other;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [3] = (double)vStack_28a8.m_value;
    Eigen::Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false> *)local_2a60,&local_1280,
               0,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,64,0,9,64>,3,8,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,8,1,3,8>,3,1,false>,Eigen::Matrix<double,1,8,1,1,8>,0>>
              ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false> *)local_2a60,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false>,_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_0>
                *)&local_2480);
    Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false> *)local_28c0,&local_2600,0,
               lVar12);
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [6] = (double)&local_2900;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [4] = (double)vStack_28a0.m_value;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [5] = dStack_2898;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [0] = (double)local_28c0._0_8_;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [1] = (double)local_28c0._8_8_;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [2] = sStack_28b0.m_other;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [3] = (double)vStack_28a8.m_value;
    Eigen::Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false> *)local_2a60,&local_1280,
               3,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,64,0,9,64>,3,8,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,8,1,3,8>,3,1,false>,Eigen::Matrix<double,1,8,1,1,8>,0>>
              ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false> *)local_2a60,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false>,_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_0>
                *)&local_2480);
    Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false> *)local_28c0,&local_2600,0,
               lVar12);
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [6] = (double)&local_2940;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [4] = (double)vStack_28a0.m_value;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [5] = dStack_2898;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [0] = (double)local_28c0._0_8_;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [1] = (double)local_28c0._8_8_;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [2] = sStack_28b0.m_other;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
    [3] = (double)vStack_28a8.m_value;
    Eigen::Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false> *)local_2a60,&local_1280,
               6,lVar11);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,64,0,9,64>,3,8,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,8,1,3,8>,3,1,false>,Eigen::Matrix<double,1,8,1,1,8>,0>>
              ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_8,_false> *)local_2a60,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_3,_1,_false>,_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_0>
                *)&local_2480);
    lVar11 = lVar11 + 8;
  }
  local_2a60[0] = &local_1280;
  Eigen::
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_64,_0,_9,_64>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
  ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_64,_0,_9,_64>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
             *)local_28c0,(Lhs *)local_2a60,&this->m_O2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,64,0,9,64>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,64,0,9,64>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,9,64,0,9,64>> *)&local_2480,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_64,_0,_9,_64>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_28c0);
  for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
    lVar10 = lVar11 * 3;
    startCol = lVar11;
    for (lVar12 = 2; lVar12 != 0x1a; lVar12 = lVar12 + 3) {
      Eigen::Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false> *)local_28c0,
                 &local_2480,0,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)local_2a60,H,lVar10,lVar12 + -2);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,9,64,0,9,64>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)local_2a60,
                 (Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false> *)local_28c0);
      Eigen::Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false> *)local_28c0,
                 &local_2480,3,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)local_2a60,H,lVar10,lVar12 + -1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,9,64,0,9,64>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)local_2a60,
                 (Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false> *)local_28c0);
      Eigen::Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false> *)local_28c0,
                 &local_2480,6,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)local_2a60,H,lVar10,lVar12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,9,64,0,9,64>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)local_2a60,
                 (Block<Eigen::Matrix<double,_9,_64,_0,_9,_64>,_3,_1,_false> *)local_28c0);
      startCol = startCol + 8;
    }
  }
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = Kfactor;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(auVar4,auVar2);
  local_2ae8._0_8_ = vmovlpd_avx(auVar13);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_2a60,(double *)&local_2ae8,(StorageBaseType *)&this->m_K13Compact);
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>> *)local_28c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_2a60);
  Eigen::operator*(&local_2ae8,&local_2af0,(StorageBaseType *)&this->m_MassMatrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,36,1,0,36,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,36,1,0,36,1>const>const,Eigen::Matrix<double,36,1,0,36,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,36,1,0,36,1>> *)local_2a60,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>_>
              *)&local_2ae8);
  lVar11 = -0xfffffff2;
  uVar9 = 0;
  for (row = 0; row != 8; row = row + 1) {
    lVar12 = 2;
    col = 0;
    lVar10 = 8;
    while (lVar10 != 0) {
      if (col < row) {
        uVar5 = ((int)lVar10 * ((int)col + -7) + 0x38U >> 1) + (int)row;
      }
      else {
        uVar5 = ((uint)(uVar9 >> 1) & 0x7fffffff) + (int)col;
      }
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)local_2a60,
                          (ulong)uVar5);
      dVar1 = *pSVar6;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_1> *)local_28c0,row
                          ,col);
      dVar1 = dVar1 + *pSVar7;
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,row * 3,lVar12 + -2);
      *pSVar8 = dVar1 + *pSVar8;
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,row * 3 + 1,lVar12 + -1);
      *pSVar8 = dVar1 + *pSVar8;
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,row * 3 + 2,lVar12);
      col = col + 1;
      lVar12 = lVar12 + 3;
      *pSVar8 = dVar1 + *pSVar8;
      lVar10 = lVar10 + -1;
    }
    uVar9 = uVar9 + lVar11;
    lVar11 = lVar11 + -2;
  }
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  Since computationally expensive quantities are
    // required for both the generalized internal force vector and its Jacobian, these values were cached for reuse
    // during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}